

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneticAlgorithm.cpp
# Opt level: O0

GeneticAlgorithm * __thiscall GeneticAlgorithm::setPopulationSize(GeneticAlgorithm *this,int x)

{
  string *this_00;
  allocator local_15;
  int local_14;
  GeneticAlgorithm *pGStack_10;
  int x_local;
  GeneticAlgorithm *this_local;
  
  if (x < 2) {
    local_14 = x;
    pGStack_10 = this;
    this_00 = (string *)__cxa_allocate_exception(0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this_00,"Population size too small",&local_15);
    __cxa_throw(this_00,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  this->destinatedPopulationSize = x;
  return this;
}

Assistant:

GeneticAlgorithm& GeneticAlgorithm::setPopulationSize(int x){ 
	if(x<2) throw std::string("Population size too small");
		destinatedPopulationSize = x;
	return *this;
}